

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O2

int fy_push_indent(fy_parser *fyp,int indent,_Bool generated_block_map)

{
  uint uVar1;
  list_head *plVar2;
  fy_indent *pfVar3;
  int iVar4;
  char *pcVar5;
  
  pfVar3 = fy_parse_indent_alloc(fyp);
  if (pfVar3 == (fy_indent *)0x0) {
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x367,"fy_push_indent","fy_indent_alloc() failed");
    iVar4 = -1;
  }
  else {
    pfVar3->indent = fyp->indent;
    pfVar3->field_0x14 = pfVar3->field_0x14 & 0xfe | (byte)fyp->field_0x70 >> 5 & 1;
    plVar2 = (fyp->indent_stack)._lh.next;
    plVar2->prev = &pfVar3->node;
    (pfVar3->node).next = plVar2;
    (pfVar3->node).prev = &(fyp->indent_stack)._lh;
    (fyp->indent_stack)._lh.next = &pfVar3->node;
    uVar1 = fyp->indent;
    fyp->parent_indent = uVar1;
    fyp->indent = indent;
    *(ushort *)&fyp->field_0x70 =
         (ushort)*(undefined4 *)&fyp->field_0x70 & 0xffdf | (ushort)generated_block_map << 5;
    pcVar5 = "false";
    if (generated_block_map) {
      pcVar5 = "true";
    }
    iVar4 = 0;
    fy_parser_diag(fyp,0x20,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x376,"fy_push_indent","push_indent %d -> %d - generated_block_map=%s\n",
                   (ulong)uVar1,indent,pcVar5);
  }
  return iVar4;
}

Assistant:

int fy_push_indent(struct fy_parser *fyp, int indent, bool generated_block_map) {
    struct fy_indent *fyit;

    fyit = fy_parse_indent_alloc(fyp);
    fyp_error_check(fyp, fyit != NULL, err_out,
                    "fy_indent_alloc() failed");

    fyit->indent = fyp->indent;
    fyit->generated_block_map = fyp->generated_block_map;

    /* push */
    fy_indent_list_push(&fyp->indent_stack, fyit);

    /* update current state */
    fyp->parent_indent = fyp->indent;
    fyp->indent = indent;
    fyp->generated_block_map = generated_block_map;

    fyp_scan_debug(fyp, "push_indent %d -> %d - generated_block_map=%s\n",
                   fyp->parent_indent, fyp->indent,
                   fyp->generated_block_map ? "true" : "false");

    return 0;

    err_out:
    return -1;
}